

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_array.c
# Opt level: O0

ares_status_t ares_array_set_size(ares_array_t *arr,size_t size)

{
  void *pvVar1;
  void *temp;
  size_t size_local;
  ares_array_t *arr_local;
  
  if (((arr == (ares_array_t *)0x0) || (size == 0)) || (size < arr->cnt)) {
    arr_local._4_4_ = ARES_EFORMERR;
  }
  else {
    temp = (void *)ares_round_up_pow2(size);
    if (temp < (void *)0x4) {
      temp = (void *)0x4;
    }
    if ((void *)arr->alloc_cnt < temp) {
      pvVar1 = ares_realloc_zero(arr->arr,arr->alloc_cnt * arr->member_size,
                                 (long)temp * arr->member_size);
      if (pvVar1 == (void *)0x0) {
        arr_local._4_4_ = ARES_ENOMEM;
      }
      else {
        arr->alloc_cnt = (size_t)temp;
        arr->arr = pvVar1;
        arr_local._4_4_ = ARES_SUCCESS;
      }
    }
    else {
      arr_local._4_4_ = ARES_SUCCESS;
    }
  }
  return arr_local._4_4_;
}

Assistant:

ares_status_t ares_array_set_size(ares_array_t *arr, size_t size)
{
  void *temp;

  if (arr == NULL || size == 0 || size < arr->cnt) {
    return ARES_EFORMERR;
  }

  /* Always operate on powers of 2 */
  size = ares_round_up_pow2(size);

  if (size < ARES__ARRAY_MIN) {
    size = ARES__ARRAY_MIN;
  }

  /* If our allocation size is already large enough, skip */
  if (size <= arr->alloc_cnt) {
    return ARES_SUCCESS;
  }

  temp = ares_realloc_zero(arr->arr, arr->alloc_cnt * arr->member_size,
                           size * arr->member_size);
  if (temp == NULL) {
    return ARES_ENOMEM;
  }
  arr->alloc_cnt = size;
  arr->arr       = temp;
  return ARES_SUCCESS;
}